

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStandardAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_2278eb::generatedFunctions(void)

{
  byte bVar1;
  ostream *this;
  Header header;
  Vec2<float> local_40;
  Header local_38 [56];
  
  this = std::operator<<((ostream *)&std::cout,"automatically generated functions");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec2<float>::Vec2(&local_40,0.0,0.0);
  Imf_3_4::Header::Header(local_38,0x40,0x40,1.0,(Vec2 *)&local_40,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  bVar1 = Imf_3_4::hasOriginalDataWindow(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasOriginalDataWindow (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x356,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasWorldToCamera(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasWorldToCamera (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x357,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasWorldToNDC(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasWorldToNDC (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x358,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasAscFramingDecisionList(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasAscFramingDecisionList (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x359,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasSensorCenterOffset(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasSensorCenterOffset (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x35a,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasSensorOverallDimensions(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasSensorOverallDimensions (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x35b,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasSensorPhotositePitch(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasSensorPhotositePitch (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x35c,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasSensorAcquisitionRectangle(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasSensorAcquisitionRectangle (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x35d,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasXDensity(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasXDensity (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x35e,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasLongitude(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasLongitude (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x35f,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasLatitude(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasLatitude (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x360,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasAltitude(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasAltitude (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x361,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasCameraMake(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasCameraMake (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x362,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasCameraModel(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasCameraModel (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x363,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasCameraSerialNumber(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasCameraSerialNumber (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x364,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasCameraFirmwareVersion(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasCameraFirmwareVersion (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x365,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasCameraUuid(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasCameraUuid (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x366,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasCameraLabel(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasCameraLabel (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x367,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasCameraCCTSetting(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasCameraCCTSetting (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x368,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasCameraTintSetting(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasCameraTintSetting (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x369,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasCameraColorBalance(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasCameraColorBalance (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x36a,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasIsoSpeed(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasIsoSpeed (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x36b,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasExpTime(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasExpTime (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x36c,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasShutterAngle(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasShutterAngle (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x36d,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasCaptureRate(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasCaptureRate (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x36e,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasLensMake(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasLensMake (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x36f,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasLensModel(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasLensModel (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x370,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasLensSerialNumber(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasLensSerialNumber (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x371,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasLensFirmwareVersion(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasLensFirmwareVersion (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x372,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasNominalFocalLength(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasNominalFocalLength (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x373,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasPinholeFocalLength(local_38);
  if ((bVar1 & 1) != 0) {
    __assert_fail("hasPinholeFocalLength (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x374,"void (anonymous namespace)::generatedFunctions()");
  }
  bVar1 = Imf_3_4::hasEffectiveFocalLength(local_38);
  if ((bVar1 & 1) == 0) {
    bVar1 = Imf_3_4::hasEntrancePupilOffset(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasEntrancePupilOffset (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x376,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasAperture(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasAperture (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x377,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasTStop(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasTStop (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x378,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasFocus(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasFocus (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x379,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasOwner(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasOwner (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x37a,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasComments(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasComments (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x37b,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasCapDate(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasCapDate (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x37c,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasUtcOffset(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasUtcOffset (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x37d,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasKeyCode(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasKeyCode (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x37e,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasTimeCode(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasTimeCode (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x37f,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasFramesPerSecond(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasFramesPerSecond (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x380,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasImageCounter(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasImageCounter (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x381,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasReelName(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasReelName (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x382,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasChromaticities(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasChromaticities (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,899,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasWhiteLuminance(local_38);
    if ((bVar1 & 1) != 0) {
      __assert_fail("hasWhiteLuminance (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,900,"void (anonymous namespace)::generatedFunctions()");
    }
    bVar1 = Imf_3_4::hasAdoptedNeutral(local_38);
    if ((bVar1 & 1) == 0) {
      bVar1 = Imf_3_4::hasRenderingTransform(local_38);
      if ((bVar1 & 1) != 0) {
        __assert_fail("hasRenderingTransform (header) == false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                      ,0x386,"void (anonymous namespace)::generatedFunctions()");
      }
      bVar1 = Imf_3_4::hasLookModTransform(local_38);
      if ((bVar1 & 1) != 0) {
        __assert_fail("hasLookModTransform (header) == false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                      ,0x387,"void (anonymous namespace)::generatedFunctions()");
      }
      bVar1 = Imf_3_4::hasEnvmap(local_38);
      if ((bVar1 & 1) != 0) {
        __assert_fail("hasEnvmap (header) == false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                      ,0x388,"void (anonymous namespace)::generatedFunctions()");
      }
      bVar1 = Imf_3_4::hasWrapmodes(local_38);
      if ((bVar1 & 1) == 0) {
        bVar1 = Imf_3_4::hasMultiView(local_38);
        if ((bVar1 & 1) != 0) {
          __assert_fail("hasMultiView (header) == false",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                        ,0x38a,"void (anonymous namespace)::generatedFunctions()");
        }
        bVar1 = Imf_3_4::hasDeepImageState(local_38);
        if ((bVar1 & 1) == 0) {
          bVar1 = Imf_3_4::hasIDManifest(local_38);
          if ((bVar1 & 1) == 0) {
            Imf_3_4::Header::~Header(local_38);
            return;
          }
          __assert_fail("hasIDManifest (header) == false",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                        ,0x38c,"void (anonymous namespace)::generatedFunctions()");
        }
        __assert_fail("hasDeepImageState (header) == false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                      ,0x38b,"void (anonymous namespace)::generatedFunctions()");
      }
      __assert_fail("hasWrapmodes (header) == false",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                    ,0x389,"void (anonymous namespace)::generatedFunctions()");
    }
    __assert_fail("hasAdoptedNeutral (header) == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                  ,0x385,"void (anonymous namespace)::generatedFunctions()");
  }
  __assert_fail("hasEffectiveFocalLength (header) == false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testStandardAttributes.cpp"
                ,0x375,"void (anonymous namespace)::generatedFunctions()");
}

Assistant:

void
generatedFunctions ()
{
    //
    // Most optional standard attributes are of type string, float,
    // etc.  The attribute types are already being tested elsewhere
    // (testAttributes.C), and the convenience functions to access
    // the standard attributes are all generated via macros.  Here
    // we just verify that all the convenience functions exist
    // (that is, ImfStandardAttributes.C and ImfStandardAttributes.h
    // contain the right macro invocations).  If any functions are
    // missing, we should get an error during compiling or linking.
    //

    cout << "automatically generated functions" << endl;

    Header header;

    assert (hasOriginalDataWindow (header) == false);
    assert (hasWorldToCamera (header) == false);
    assert (hasWorldToNDC (header) == false);
    assert (hasAscFramingDecisionList (header) == false);
    assert (hasSensorCenterOffset (header) == false);
    assert (hasSensorOverallDimensions (header) == false);
    assert (hasSensorPhotositePitch (header) == false);
    assert (hasSensorAcquisitionRectangle (header) == false);
    assert (hasXDensity (header) == false);
    assert (hasLongitude (header) == false);
    assert (hasLatitude (header) == false);
    assert (hasAltitude (header) == false);
    assert (hasCameraMake (header) == false);
    assert (hasCameraModel (header) == false);
    assert (hasCameraSerialNumber (header) == false);
    assert (hasCameraFirmwareVersion (header) == false);
    assert (hasCameraUuid (header) == false);
    assert (hasCameraLabel (header) == false);
    assert (hasCameraCCTSetting (header) == false);
    assert (hasCameraTintSetting (header) == false);
    assert (hasCameraColorBalance (header) == false);
    assert (hasIsoSpeed (header) == false);
    assert (hasExpTime (header) == false);
    assert (hasShutterAngle (header) == false);
    assert (hasCaptureRate (header) == false);
    assert (hasLensMake (header) == false);
    assert (hasLensModel (header) == false);
    assert (hasLensSerialNumber (header) == false);
    assert (hasLensFirmwareVersion (header) == false);
    assert (hasNominalFocalLength (header) == false);
    assert (hasPinholeFocalLength (header) == false);
    assert (hasEffectiveFocalLength (header) == false);
    assert (hasEntrancePupilOffset (header) == false);
    assert (hasAperture (header) == false);
    assert (hasTStop (header) == false);
    assert (hasFocus (header) == false);
    assert (hasOwner (header) == false);
    assert (hasComments (header) == false);
    assert (hasCapDate (header) == false);
    assert (hasUtcOffset (header) == false);
    assert (hasKeyCode (header) == false);
    assert (hasTimeCode (header) == false);
    assert (hasFramesPerSecond (header) == false);
    assert (hasImageCounter (header) == false);
    assert (hasReelName (header) == false);
    assert (hasChromaticities (header) == false);
    assert (hasWhiteLuminance (header) == false);
    assert (hasAdoptedNeutral (header) == false);
    assert (hasRenderingTransform (header) == false);
    assert (hasLookModTransform (header) == false);
    assert (hasEnvmap (header) == false);
    assert (hasWrapmodes (header) == false);
    assert (hasMultiView (header) == false);
    assert (hasDeepImageState (header) == false);
    assert (hasIDManifest (header) == false);
}